

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addImplicitData
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,DataStringT *data)

{
  Memory *pMVar1;
  Module *module;
  char *pcVar2;
  Const *pCVar3;
  string_view sVar4;
  Builder local_50;
  string_view local_48;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  __single_object d;
  
  pMVar1 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  std::make_unique<wasm::DataSegment>();
  pcVar2 = *(char **)((long)&(pMVar1->super_Importable).super_Named + 8);
  ((local_38._M_head_impl)->memory).super_IString.str._M_len =
       *(size_t *)&(pMVar1->super_Importable).super_Named;
  ((local_38._M_head_impl)->memory).super_IString.str._M_str = pcVar2;
  (local_38._M_head_impl)->isPassive = false;
  local_50.wasm = this->wasm;
  pCVar3 = Builder::makeConstPtr(&local_50,0,(Type)(pMVar1->addressType).id);
  (local_38._M_head_impl)->offset = (Expression *)pCVar3;
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&(local_38._M_head_impl)->data,data);
  module = this->wasm;
  Name::Name((Name *)&local_48,"implicit-data");
  sVar4 = (string_view)Names::getValidDataSegmentName(module,(Name)local_48);
  ((local_38._M_head_impl)->super_Named).name.super_IString.str = sVar4;
  Module::addDataSegment
            (this->wasm,
             (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addImplicitData(DataStringT&& data) {
  auto& mem = *wasm.memories.back();
  auto d = std::make_unique<DataSegment>();
  d->memory = mem.name;
  d->isPassive = false;
  d->offset = Builder(wasm).makeConstPtr(0, mem.addressType);
  d->data = std::move(data);
  d->name = Names::getValidDataSegmentName(wasm, "implicit-data");
  wasm.addDataSegment(std::move(d));
  return Ok{};
}